

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

edge_id __thiscall TreePropagator::findEdge(TreePropagator *this,int u,int v,int idx)

{
  long lVar1;
  long lVar2;
  int iVar3;
  edge_id eVar4;
  
  iVar3 = v;
  if (v < u) {
    iVar3 = u;
  }
  if (u < v) {
    v = u;
  }
  lVar1 = *(long *)&(this->nodes2edge).
                    super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[v].
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data;
  lVar2 = *(long *)(lVar1 + (long)iVar3 * 0x18);
  eVar4 = -1;
  if (idx < (int)((ulong)(*(long *)(lVar1 + 8 + (long)iVar3 * 0x18) - lVar2) >> 2)) {
    eVar4 = *(edge_id *)(lVar2 + (long)idx * 4);
  }
  return eVar4;
}

Assistant:

edge_id TreePropagator::findEdge(int u, int v, int idx) {
	if (u > v) {  // If I only read one, I only need to update one...
		const int tmp = u;
		u = v;
		v = tmp;
	}
	if (static_cast<int>(nodes2edge[u][v].size()) <= idx) {
		return -1;
	}
	return nodes2edge[u][v][idx];
}